

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

AffineSpace3ff * __thiscall
embree::SceneGraph::Transformations::interpolate
          (AffineSpace3ff *__return_storage_ptr__,Transformations *this,float gtime)

{
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar1;
  Vector *pVVar2;
  Vector *pVVar3;
  Vector *pVVar4;
  size_t sVar5;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar6;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  
  sVar5 = (this->spaces).size_active;
  if (sVar5 == 1) {
    pAVar6 = (this->spaces).items;
    fVar11 = (pAVar6->l).vx.field_0.m128[0];
    fVar17 = (pAVar6->l).vx.field_0.m128[1];
    fVar18 = (pAVar6->l).vx.field_0.m128[2];
    fVar19 = (pAVar6->l).vx.field_0.m128[3];
    fVar20 = (pAVar6->l).vy.field_0.m128[0];
    fVar21 = (pAVar6->l).vy.field_0.m128[1];
    fVar22 = (pAVar6->l).vy.field_0.m128[2];
    fVar23 = (pAVar6->l).vy.field_0.m128[3];
    fVar24 = (pAVar6->l).vz.field_0.m128[0];
    fVar25 = (pAVar6->l).vz.field_0.m128[1];
    fVar26 = (pAVar6->l).vz.field_0.m128[2];
    fVar27 = (pAVar6->l).vz.field_0.m128[3];
    fVar13 = (pAVar6->p).field_0.m128[0];
    fVar14 = (pAVar6->p).field_0.m128[1];
    fVar15 = (pAVar6->p).field_0.m128[2];
    fVar16 = (pAVar6->p).field_0.m128[3];
  }
  else {
    iVar8 = (int)sVar5;
    fVar16 = (float)(iVar8 + -1) * gtime;
    fVar11 = floorf(fVar16);
    uVar10 = iVar8 - 2;
    if ((int)fVar11 < (int)uVar10) {
      uVar10 = (int)fVar11;
    }
    uVar9 = 0;
    if (0 < (int)uVar10) {
      uVar9 = uVar10;
    }
    fVar16 = fVar16 - (float)(int)uVar9;
    pAVar7 = (this->spaces).items;
    fVar12 = 1.0 - fVar16;
    pAVar1 = pAVar7 + (ulong)uVar9 + 1;
    pAVar6 = pAVar7 + uVar9;
    fVar11 = (pAVar6->l).vx.field_0.m128[0] * fVar12 + (pAVar1->l).vx.field_0.m128[0] * fVar16;
    fVar17 = (pAVar6->l).vx.field_0.m128[1] * fVar12 + (pAVar1->l).vx.field_0.m128[1] * fVar16;
    fVar18 = (pAVar6->l).vx.field_0.m128[2] * fVar12 + (pAVar1->l).vx.field_0.m128[2] * fVar16;
    fVar19 = (pAVar6->l).vx.field_0.m128[3] * fVar12 + (pAVar1->l).vx.field_0.m128[3] * fVar16;
    pVVar4 = &pAVar7[(ulong)uVar9 + 1].l.vy;
    pVVar2 = &pAVar7[uVar9].l.vy;
    fVar20 = (pVVar2->field_0).m128[0] * fVar12 + (pVVar4->field_0).m128[0] * fVar16;
    fVar21 = (pVVar2->field_0).m128[1] * fVar12 + (pVVar4->field_0).m128[1] * fVar16;
    fVar22 = (pVVar2->field_0).m128[2] * fVar12 + (pVVar4->field_0).m128[2] * fVar16;
    fVar23 = (pVVar2->field_0).m128[3] * fVar12 + (pVVar4->field_0).m128[3] * fVar16;
    pVVar4 = &pAVar7[(ulong)uVar9 + 1].l.vz;
    pVVar2 = &pAVar7[uVar9].l.vz;
    pVVar3 = &pAVar7[(ulong)uVar9 + 1].p;
    fVar24 = (pVVar2->field_0).m128[0] * fVar12 + (pVVar4->field_0).m128[0] * fVar16;
    fVar25 = (pVVar2->field_0).m128[1] * fVar12 + (pVVar4->field_0).m128[1] * fVar16;
    fVar26 = (pVVar2->field_0).m128[2] * fVar12 + (pVVar4->field_0).m128[2] * fVar16;
    fVar27 = (pVVar2->field_0).m128[3] * fVar12 + (pVVar4->field_0).m128[3] * fVar16;
    pVVar4 = &pAVar7[uVar9].p;
    fVar13 = fVar12 * (pVVar4->field_0).m128[0] + fVar16 * (pVVar3->field_0).m128[0];
    fVar14 = fVar12 * (pVVar4->field_0).m128[1] + fVar16 * (pVVar3->field_0).m128[1];
    fVar15 = fVar12 * (pVVar4->field_0).m128[2] + fVar16 * (pVVar3->field_0).m128[2];
    fVar16 = fVar12 * (pVVar4->field_0).m128[3] + fVar16 * (pVVar3->field_0).m128[3];
  }
  (__return_storage_ptr__->l).vx.field_0.m128[0] = fVar11;
  (__return_storage_ptr__->l).vx.field_0.m128[1] = fVar17;
  (__return_storage_ptr__->l).vx.field_0.m128[2] = fVar18;
  (__return_storage_ptr__->l).vx.field_0.m128[3] = fVar19;
  (__return_storage_ptr__->l).vy.field_0.m128[0] = fVar20;
  (__return_storage_ptr__->l).vy.field_0.m128[1] = fVar21;
  (__return_storage_ptr__->l).vy.field_0.m128[2] = fVar22;
  (__return_storage_ptr__->l).vy.field_0.m128[3] = fVar23;
  (__return_storage_ptr__->l).vz.field_0.m128[0] = fVar24;
  (__return_storage_ptr__->l).vz.field_0.m128[1] = fVar25;
  (__return_storage_ptr__->l).vz.field_0.m128[2] = fVar26;
  (__return_storage_ptr__->l).vz.field_0.m128[3] = fVar27;
  (__return_storage_ptr__->p).field_0.m128[0] = fVar13;
  (__return_storage_ptr__->p).field_0.m128[1] = fVar14;
  (__return_storage_ptr__->p).field_0.m128[2] = fVar15;
  (__return_storage_ptr__->p).field_0.m128[3] = fVar16;
  return __return_storage_ptr__;
}

Assistant:

AffineSpace3ff interpolate (const float gtime) const
      {
        assert(time_range.lower == 0.0f && time_range.upper == 1.0f);
        if (spaces.size() == 1) return spaces[0];

        /* calculate time segment itime and fractional time ftime */
        const int time_segments = int(spaces.size()-1);
        const float time = gtime*float(time_segments);
        const int itime = clamp(int(floor(time)),0,time_segments-1);
        const float ftime = time - float(itime);
        return lerp(spaces[itime+0],spaces[itime+1],ftime);
      }